

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

size_t __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateOffsets
          (MessageGenerator *this,Printer *p)

{
  Options *opts;
  byte bVar1;
  int iVar2;
  int iVar3;
  Descriptor *pDVar4;
  pointer piVar5;
  pointer piVar6;
  ushort *puVar7;
  int *piVar8;
  bool bVar9;
  value_type_conflict this_00;
  OneofDescriptor *pOVar10;
  value_type pOVar11;
  Nullable<const_char_*> failure_msg;
  AlphaNum *pAVar12;
  undefined1 split;
  AlphaNum *pAVar13;
  FieldDescriptor *field;
  AlphaNum *a;
  int *piVar14;
  uint uVar15;
  int iVar16;
  char *format_00;
  AlphaNum *pAVar17;
  Span<const_google::protobuf::io::Printer::Sub> vars;
  Span<const_google::protobuf::io::Printer::Sub> vars_00;
  size_t offsets;
  Iterator __begin3_1;
  Formatter format;
  string index_1;
  Iterator __begin3;
  Iterator __end3_1;
  Iterator __end3;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  t;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v;
  size_t local_268;
  size_t local_240;
  uint local_234;
  AlphaNum local_230;
  Formatter local_200;
  string local_1d8;
  string local_1b8;
  pointer local_198;
  char *local_190;
  undefined1 local_188 [16];
  AlphaNum local_178;
  Iterator local_148;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  local_138;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  local_120;
  Options local_108;
  
  pDVar4 = this->descriptor_;
  opts = &this->options_;
  Options::Options(&local_108,opts);
  cpp::anon_unknown_0::ClassVars
            ((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
              *)&local_230,pDVar4,&local_108);
  vars.len_ = (long)((long)local_230.piece_._M_str - local_230.piece_._M_len) / 0xb8;
  vars.ptr_ = (pointer)local_230.piece_._M_len;
  io::Printer::WithVars(&local_120,p,vars);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *)&local_230);
  Options::~Options(&local_108);
  MakeTrackerCalls((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                    *)&local_230,this->descriptor_,opts);
  vars_00.len_ = (long)((long)local_230.piece_._M_str - local_230.piece_._M_len) / 0xb8;
  vars_00.ptr_ = (pointer)local_230.piece_._M_len;
  io::Printer::WithVars(&local_138,p,vars_00);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *)&local_230);
  local_200.vars_.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  local_200.vars_.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  local_200.vars_.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
  pDVar4 = this->descriptor_;
  bVar1 = 1;
  if ((this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar1 = (pDVar4->options_->field_0)._impl_.map_entry_;
  }
  iVar16 = pDVar4->real_oneof_decl_count_;
  iVar2 = pDVar4->extension_range_count_;
  iVar3 = this->num_weak_fields_;
  piVar5 = (this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar6 = (this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_200.printer_ = p;
  bVar9 = ShouldSplit(pDVar4,opts);
  uVar15 = (uint)(piVar5 != piVar6);
  local_234 = (uint)bVar1;
  local_198 = piVar6;
  local_230.piece_ = absl::lts_20250127::NullSafeStringView("0x");
  local_188._8_2_ = 0x3003;
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  local_1d8.field_2._M_allocated_capacity = 0;
  local_1d8.field_2._8_8_ = 0;
  local_1d8._M_string_length = 0;
  local_188._0_8_ =
       (ulong)(uVar15 << 8 | (uint)bVar9 << 6 | (uint)bVar9 << 5 | (uint)bVar1 |
              (uint)bVar1 * 0x80 + (uint)(0 < iVar2) * 2 + (uint)(0 < iVar16) * 4 +
              (uint)(0 < iVar3) * 8 | uVar15 << 4);
  local_178.piece_ =
       absl::lts_20250127::strings_internal::ExtractStringification<absl::lts_20250127::Hex>
                 ((StringifySink *)&local_1d8,(Hex *)local_188);
  absl::lts_20250127::StrCat_abi_cxx11_(&local_1b8,(lts_20250127 *)&local_230,&local_178,&local_178)
  ;
  std::__cxx11::string::~string((string *)&local_1d8);
  Formatter::operator()(&local_200,"$1$, // bitmap\n",&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  piVar6 = local_198;
  if (bVar1 != 0) {
    Formatter::operator()<>(&local_200,"PROTOBUF_FIELD_OFFSET($classtype$, $has_bits$),\n");
  }
  if (0 < iVar2) {
    Formatter::operator()<>(&local_200,"PROTOBUF_FIELD_OFFSET($classtype$, $extensions$),\n");
  }
  if (0 < iVar16) {
    Formatter::operator()<>(&local_200,"PROTOBUF_FIELD_OFFSET($classtype$, $oneof_case$[0]),\n");
  }
  if (0 < iVar3) {
    Formatter::operator()<>(&local_200,"PROTOBUF_FIELD_OFFSET($classtype$, $weak_field_map$),\n");
  }
  if (piVar5 != piVar6) {
    Formatter::operator()<>
              (&local_200,"PROTOBUF_FIELD_OFFSET($classtype$, $inlined_string_donated_array$),\n");
  }
  if (bVar9) {
    Formatter::operator()<>
              (&local_200,
               "PROTOBUF_FIELD_OFFSET($classtype$, $split$),\nsizeof($classtype$::Impl_::Split),\n")
    ;
  }
  local_240 = (size_t)(int)((uint)(0 < iVar3) + (uint)bVar9 * 2 +
                            (uint)(0 < iVar2) + (uint)(0 < iVar16) + this->descriptor_->field_count_
                            + this->descriptor_->real_oneof_decl_count_ + (uVar15 + local_234) * 2 +
                           1);
  if (bVar1 != 0) {
    Formatter::operator()(&local_200,"$1$, // hasbit index offset\n",&local_240);
  }
  if (piVar5 != piVar6) {
    local_230.piece_._M_len =
         ((long)(this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2) + local_240;
    Formatter::operator()
              (&local_200,"$1$, // inline string index offset\n",(unsigned_long *)&local_230);
  }
  local_268 = local_240;
  local_188._8_8_ = this->descriptor_;
  local_188._0_8_ = local_188._0_8_ & 0xffffffff00000000;
  local_148.idx = ((Descriptor *)local_188._8_8_)->field_count_;
  local_148.descriptor = (Descriptor *)local_188._8_8_;
  do {
    bVar9 = protobuf::internal::operator!=((Iterator *)local_188,&local_148);
    if (!bVar9) {
      pDVar4 = this->descriptor_;
      local_230.piece_._M_len = local_230.piece_._4_8_ << 0x20;
      local_230.piece_._M_str = (char *)pDVar4;
      pAVar13 = (AlphaNum *)(ulong)(uint)pDVar4->real_oneof_decl_count_;
      local_178.piece_._M_len._0_4_ = pDVar4->real_oneof_decl_count_;
      local_178.piece_._M_str = (char *)pDVar4;
      iVar16 = 0;
      while (bVar9 = cpp::operator!=((Iterator *)&local_230,(Iterator *)&local_178), bVar9) {
        pOVar11 = OneOfRangeImpl::Iterator::operator*((Iterator *)&local_230);
        puVar7 = (ushort *)(pOVar11->all_names_).payload_;
        local_1d8._M_dataplus._M_p = (pointer)(ulong)*puVar7;
        pAVar13 = (AlphaNum *)((long)puVar7 + ~(ulong)local_1d8._M_dataplus._M_p);
        local_1d8._M_string_length = (size_type)pAVar13;
        Formatter::operator()
                  (&local_200,"PROTOBUF_FIELD_OFFSET($classtype$, _impl_.$1$_),\n",
                   (basic_string_view<char,_std::char_traits<char>_> *)&local_1d8);
        iVar16 = iVar16 + 1;
        local_230.piece_._M_len._0_4_ = (int)local_230.piece_._M_len + 1;
      }
      failure_msg = absl::lts_20250127::log_internal::Check_EQImpl
                              (iVar16,this->descriptor_->real_oneof_decl_count_,
                               "count == descriptor_->real_oneof_decl_count()");
      if (failure_msg != (Nullable<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_230,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message.cc"
                   ,0xa86,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_230);
      }
      if ((this->descriptor_->options_->field_0)._impl_.map_entry_ == true) {
        Formatter::operator()<>(&local_200,"0,\n1,\n");
        local_268 = local_268 + 2;
      }
      else {
        pAVar12 = (AlphaNum *)
                  (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pAVar13 = (AlphaNum *)
                  (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (pAVar12 != pAVar13) {
          local_268 = local_268 + ((long)pAVar13 - (long)pAVar12 >> 2);
          for (pAVar17 = (AlphaNum *)0x0; pAVar13 = (AlphaNum *)((long)pAVar13 - (long)pAVar12 >> 2)
              , pAVar17 < pAVar13; pAVar17 = (AlphaNum *)((long)&(pAVar17->piece_)._M_len + 1)) {
            if (*(int *)(pAVar12->digits_ + (long)pAVar17 * 4 + -0x10) < 0) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_178,"~0u",(allocator<char> *)&local_1d8);
            }
            else {
              absl::lts_20250127::AlphaNum::AlphaNum
                        (&local_230,*(int *)(pAVar12->digits_ + (long)pAVar17 * 4 + -0x10));
              absl::lts_20250127::StrCat_abi_cxx11_
                        ((string *)&local_178,(lts_20250127 *)&local_230,a);
            }
            Formatter::operator()
                      (&local_200,"$1$,\n",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_178);
            std::__cxx11::string::~string((string *)&local_178);
            pAVar12 = (AlphaNum *)
                      (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                      .super__Vector_impl_data._M_start;
            pAVar13 = (AlphaNum *)
                      (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                      .super__Vector_impl_data._M_finish;
          }
        }
      }
      piVar14 = (this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      piVar8 = (this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl
               .super__Vector_impl_data._M_finish;
      if (piVar14 != piVar8) {
        local_268 = local_268 + ((long)piVar8 - (long)piVar14 >> 2);
        for (; piVar14 != piVar8; piVar14 = piVar14 + 1) {
          if (*piVar14 < 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1d8,"~0u,",(allocator<char> *)local_188);
          }
          else {
            absl::lts_20250127::AlphaNum::AlphaNum(&local_230,*piVar14);
            local_178.piece_ = absl::lts_20250127::NullSafeStringView(",  // inlined_string_index");
            absl::lts_20250127::StrCat_abi_cxx11_
                      (&local_1d8,(lts_20250127 *)&local_230,&local_178,pAVar13);
          }
          Formatter::operator()(&local_200,"$1$\n",&local_1d8);
          std::__cxx11::string::~string((string *)&local_1d8);
        }
      }
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&local_200.vars_);
      absl::lts_20250127::
      Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
      ::~Cleanup(&local_138);
      absl::lts_20250127::
      Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
      ::~Cleanup(&local_120);
      return local_268;
    }
    this_00 = protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::Iterator::operator*
                        ((Iterator *)local_188);
    if (((this_00->options_->field_0)._impl_.weak_ == false) &&
       (pOVar10 = FieldDescriptor::real_containing_oneof(this_00), pOVar10 == (OneofDescriptor *)0x0
       )) {
      bVar9 = ShouldSplit(this_00,opts);
      local_190 = "";
      split = 0xd5;
      if (bVar9) {
        local_190 = "::Impl_::Split";
      }
      bVar9 = ShouldSplit(this_00,opts);
      if (bVar9) {
        FieldName_abi_cxx11_(&local_1b8,(cpp *)this_00,field);
        local_230.piece_._M_str = local_1b8._M_dataplus._M_p;
        local_230.piece_._M_len = local_1b8._M_string_length;
        pAVar13 = (AlphaNum *)local_1b8._M_string_length;
        local_178.piece_ = absl::lts_20250127::NullSafeStringView("_");
        absl::lts_20250127::StrCat_abi_cxx11_
                  (&local_1d8,(lts_20250127 *)&local_230,&local_178,pAVar13);
      }
      else {
        FieldMemberName_abi_cxx11_(&local_1d8,(cpp *)this_00,(FieldDescriptor *)0x0,(bool)split);
      }
      Formatter::operator()
                (&local_200,"PROTOBUF_FIELD_OFFSET($classtype$$1$, $2$)",&local_190,&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
      if (bVar9) {
        std::__cxx11::string::~string((string *)&local_1b8);
      }
    }
    else {
      Formatter::operator()<>(&local_200,"::_pbi::kInvalidFieldOffsetTag");
    }
    bVar9 = ShouldSplit(this_00,opts);
    if (bVar9) {
      Formatter::operator()<>(&local_200," | ::_pbi::kSplitFieldOffsetMask");
    }
    bVar9 = IsEagerlyVerifiedLazy(this_00,opts,this->scc_analyzer_);
    format_00 = " | ::_pbi::kLazyMask";
    if (bVar9) {
LAB_001ef5ba:
      Formatter::operator()<>(&local_200,format_00);
    }
    else {
      bVar9 = IsStringInlined(this_00,opts);
      format_00 = " | ::_pbi::kInlinedMask";
      if (bVar9) goto LAB_001ef5ba;
    }
    Formatter::operator()<>(&local_200,",\n");
    local_188._0_4_ = local_188._0_4_ + 1;
  } while( true );
}

Assistant:

size_t MessageGenerator::GenerateOffsets(io::Printer* p) {
  auto v = p->WithVars(ClassVars(descriptor_, options_));
  auto t = p->WithVars(MakeTrackerCalls(descriptor_, options_));
  Formatter format(p);

  int num_generated_indices = 1;
  const auto make_bitmap = [&](auto... bits) {
    uint32_t res = 0;
    int index = 0;
    ((res |= (static_cast<uint32_t>(bits) << index++)), ...);
    ((num_generated_indices += bits), ...);
    return absl::StrCat("0x", absl::Hex(res, absl::kZeroPad3));
  };

  const bool has_has_bits =
      !has_bit_indices_.empty() || IsMapEntryMessage(descriptor_);
  const bool has_extensions = descriptor_->extension_range_count() > 0;
  const bool has_oneofs = descriptor_->real_oneof_decl_count() > 0;
  const bool has_weak_fields = num_weak_fields_ > 0;
  const bool has_inline_strings = !inlined_string_indices_.empty();
  const bool has_split = ShouldSplit(descriptor_, options_);

  format("$1$, // bitmap\n",
         // These conditions have to match exactly the order done below
         make_bitmap(has_has_bits, has_extensions, has_oneofs, has_weak_fields,
                     has_inline_strings, has_split, has_split, has_has_bits,
                     has_inline_strings));

  // The order of these offsets has to match the reading of them in
  // MigrationToReflectionSchema.
  if (has_has_bits) {
    format("PROTOBUF_FIELD_OFFSET($classtype$, $has_bits$),\n");
  }
  if (has_extensions) {
    format("PROTOBUF_FIELD_OFFSET($classtype$, $extensions$),\n");
  }
  if (has_oneofs) {
    format("PROTOBUF_FIELD_OFFSET($classtype$, $oneof_case$[0]),\n");
  }
  if (has_weak_fields) {
    format("PROTOBUF_FIELD_OFFSET($classtype$, $weak_field_map$),\n");
  }
  if (has_inline_strings) {
    format(
        "PROTOBUF_FIELD_OFFSET($classtype$, "
        "$inlined_string_donated_array$),\n");
  }
  if (has_split) {
    format(
        "PROTOBUF_FIELD_OFFSET($classtype$, $split$),\n"
        "sizeof($classtype$::Impl_::Split),\n");
  }
  const size_t offsets = num_generated_indices + descriptor_->field_count() +
                         descriptor_->real_oneof_decl_count();
  if (has_has_bits) {
    format("$1$, // hasbit index offset\n", offsets);
  }
  if (has_inline_strings) {
    format("$1$, // inline string index offset\n",
           offsets + has_bit_indices_.size());
  }
  size_t entries = offsets;
  for (auto field : FieldRange(descriptor_)) {
    // TODO: We should not have an entry in the offset table for fields
    // that do not use them.
    if (field->options().weak() || field->real_containing_oneof()) {
      // Mark the field to prevent unintentional access through reflection.
      // Don't use the top bit because that is for unused fields.
      format("::_pbi::kInvalidFieldOffsetTag");
    } else {
      format("PROTOBUF_FIELD_OFFSET($classtype$$1$, $2$)",
             ShouldSplit(field, options_) ? "::Impl_::Split" : "",
             ShouldSplit(field, options_)
                 ? absl::StrCat(FieldName(field), "_")
                 : FieldMemberName(field, /*split=*/false));
    }

    // Some information about a field is in the pdproto profile. The profile is
    // only available at compile time. So we embed such information in the
    // offset of the field, so that the information is available when
    // reflectively accessing the field at run time.
    //
    // We embed whether the field is cold to the MSB of the offset, and whether
    // the field is eagerly verified lazy or inlined string to the LSB of the
    // offset.

    if (ShouldSplit(field, options_)) {
      format(" | ::_pbi::kSplitFieldOffsetMask");
    }
    if (IsEagerlyVerifiedLazy(field, options_, scc_analyzer_)) {
      format(" | ::_pbi::kLazyMask");
    } else if (IsStringInlined(field, options_)) {
      format(" | ::_pbi::kInlinedMask");
    }
    format(",\n");
  }

  int count = 0;
  for (auto oneof : OneOfRange(descriptor_)) {
    format("PROTOBUF_FIELD_OFFSET($classtype$, _impl_.$1$_),\n", oneof->name());
    count++;
  }
  ABSL_CHECK_EQ(count, descriptor_->real_oneof_decl_count());

  if (IsMapEntryMessage(descriptor_)) {
    entries += 2;
    format(
        "0,\n"
        "1,\n");
  } else if (!has_bit_indices_.empty()) {
    entries += has_bit_indices_.size();
    for (size_t i = 0; i < has_bit_indices_.size(); ++i) {
      const std::string index =
          has_bit_indices_[i] >= 0 ? absl::StrCat(has_bit_indices_[i]) : "~0u";
      format("$1$,\n", index);
    }
  }
  if (!inlined_string_indices_.empty()) {
    entries += inlined_string_indices_.size();
    for (int inlined_string_index : inlined_string_indices_) {
      const std::string index =
          inlined_string_index >= 0
              ? absl::StrCat(inlined_string_index, ",  // inlined_string_index")
              : "~0u,";
      format("$1$\n", index);
    }
  }

  return entries;
}